

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

Token * __thiscall inja::Lexer::scan_string(Token *__return_storage_ptr__,Lexer *this)

{
  char cVar1;
  ulong pos;
  bool bVar2;
  bool bVar3;
  const_reference pcVar4;
  bool bVar5;
  
  bVar3 = false;
  do {
    do {
      pos = this->m_pos;
      if ((this->m_in).size_ <= pos) goto LAB_00184e24;
      this->m_pos = pos + 1;
      pcVar4 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::data_at
                         (&this->m_in,pos);
      cVar1 = *pcVar4;
      bVar5 = cVar1 == '\\';
      bVar2 = (bool)(bVar3 | bVar5);
      bVar3 = bVar5;
    } while (bVar2);
    pcVar4 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::data_at
                       (&this->m_in,this->m_tok_start);
  } while (cVar1 != *pcVar4);
LAB_00184e24:
  make_token(__return_storage_ptr__,this,String);
  return __return_storage_ptr__;
}

Assistant:

Token scan_string() {
		bool escape{false};
		for (;;) {
			if (m_pos >= m_in.size()) break;
			char ch = m_in[m_pos++];
			if (ch == '\\') {
				escape = true;
			} else if (!escape && ch == m_in[m_tok_start]) {
				break;
			} else {
				escape = false;
			}
		}
		return make_token(Token::Kind::String);
	}